

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IGeneratorsForTest * Catch::createGeneratorsForTest(void)

{
  GeneratorsForTest *this;
  
  this = (GeneratorsForTest *)operator_new(0x50);
  memset(this,0,0x50);
  GeneratorsForTest::GeneratorsForTest(this);
  return &this->super_IGeneratorsForTest;
}

Assistant:

IGeneratorsForTest* createGeneratorsForTest()
    {
        return new GeneratorsForTest();
    }